

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_edge.c
# Opt level: O3

REF_STATUS ref_edge_rcm(REF_EDGE ref_edge,REF_INT **o2n_ptr,REF_INT **n2o_ptr)

{
  REF_NODE pRVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  REF_INT *o2n;
  long lVar4;
  REF_INT *queue;
  ulong uVar5;
  REF_INT *pRVar6;
  undefined8 uVar7;
  ulong uVar8;
  char *pcVar9;
  REF_INT *n2o;
  int iVar11;
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int iVar16;
  REF_INT nqueue;
  REF_INT ndone;
  int local_6c;
  REF_INT local_68;
  uint local_64;
  int local_60;
  int local_5c;
  REF_INT *local_58;
  REF_INT **local_50;
  REF_INT **local_48;
  REF_NODE local_40;
  REF_ADJ local_38;
  long lVar13;
  
  pRVar1 = ref_edge->node;
  *o2n_ptr = (REF_INT *)0x0;
  *n2o_ptr = (REF_INT *)0x0;
  uVar3 = pRVar1->max;
  if ((long)(int)uVar3 < 0) {
    pcVar9 = "malloc o2n of REF_INT negative";
    uVar7 = 0x31b;
LAB_001ad630:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",uVar7,
           "ref_edge_rcm",pcVar9);
    return 1;
  }
  o2n = (REF_INT *)malloc((long)(int)uVar3 * 4);
  auVar2 = _DAT_00210060;
  if (o2n == (REF_INT *)0x0) {
    pcVar9 = "malloc o2n of REF_INT NULL";
    uVar7 = 0x31b;
    goto LAB_001ad682;
  }
  if (uVar3 != 0) {
    lVar4 = (ulong)uVar3 - 1;
    auVar10._8_4_ = (int)lVar4;
    auVar10._0_8_ = lVar4;
    auVar10._12_4_ = (int)((ulong)lVar4 >> 0x20);
    lVar4 = 0;
    auVar10 = auVar10 ^ _DAT_00210060;
    auVar12 = _DAT_002139f0;
    auVar14 = _DAT_00210050;
    do {
      auVar15 = auVar14 ^ auVar2;
      iVar11 = auVar10._4_4_;
      if ((bool)(~(auVar15._4_4_ == iVar11 && auVar10._0_4_ < auVar15._0_4_ ||
                  iVar11 < auVar15._4_4_) & 1)) {
        *(undefined4 *)((long)o2n + lVar4) = 0xffffffff;
      }
      if ((auVar15._12_4_ != auVar10._12_4_ || auVar15._8_4_ <= auVar10._8_4_) &&
          auVar15._12_4_ <= auVar10._12_4_) {
        *(undefined4 *)((long)o2n + lVar4 + 4) = 0xffffffff;
      }
      auVar15 = auVar12 ^ auVar2;
      iVar16 = auVar15._4_4_;
      if (iVar16 <= iVar11 && (iVar16 != iVar11 || auVar15._0_4_ <= auVar10._0_4_)) {
        *(undefined4 *)((long)o2n + lVar4 + 8) = 0xffffffff;
        *(undefined4 *)((long)o2n + lVar4 + 0xc) = 0xffffffff;
      }
      lVar13 = auVar14._8_8_;
      auVar14._0_8_ = auVar14._0_8_ + 4;
      auVar14._8_8_ = lVar13 + 4;
      lVar13 = auVar12._8_8_;
      auVar12._0_8_ = auVar12._0_8_ + 4;
      auVar12._8_8_ = lVar13 + 4;
      lVar4 = lVar4 + 0x10;
    } while ((ulong)(uVar3 + 3 >> 2) << 4 != lVar4);
  }
  uVar8 = (ulong)(uint)pRVar1->n;
  if (pRVar1->n < 0) {
    pcVar9 = "malloc n2o of REF_INT negative";
    uVar7 = 0x31c;
    goto LAB_001ad630;
  }
  local_58 = (REF_INT *)malloc(uVar8 * 4);
  if (local_58 == (REF_INT *)0x0) {
    pcVar9 = "malloc n2o of REF_INT NULL";
    uVar7 = 0x31c;
LAB_001ad682:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",uVar7,
           "ref_edge_rcm",pcVar9);
    return 2;
  }
  local_50 = o2n_ptr;
  local_48 = n2o_ptr;
  local_40 = pRVar1;
  queue = (REF_INT *)malloc(uVar8 * 8);
  if (queue == (REF_INT *)0x0) {
    pcVar9 = "malloc queue of REF_INT NULL";
    uVar7 = 0x31d;
    goto LAB_001ad682;
  }
  local_64 = 0;
  local_68 = 0;
  n2o = local_58;
  if (uVar8 != 0) {
    do {
      pRVar1 = ref_edge->node;
      if (pRVar1->max < 1) {
        local_6c = -1;
      }
      else {
        local_38 = ref_edge->adj;
        local_60 = -1;
        local_6c = -1;
        lVar4 = 0;
        do {
          if ((-1 < pRVar1->global[lVar4]) && (o2n[lVar4] == -1)) {
            uVar3 = ref_adj_degree(local_38,(REF_INT)lVar4,&local_5c);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c"
                     ,0x2be,"ref_edge_min_degree_node",(ulong)uVar3,"deg");
              pcVar9 = "min degree node";
              uVar7 = 0x324;
              goto LAB_001ad72c;
            }
            if ((0 < local_5c) && (local_5c < local_60 || local_6c == -1)) {
              local_6c = (REF_INT)lVar4;
              local_60 = local_5c;
            }
          }
          lVar4 = lVar4 + 1;
        } while (lVar4 < pRVar1->max);
      }
      n2o = local_58;
      uVar3 = ref_edge_rcm_queue(ref_edge,local_6c,o2n,local_58,(REF_INT *)&local_64,queue,&local_68
                                );
      if (uVar3 != 0) {
        pcVar9 = "min";
        uVar7 = 0x327;
LAB_001ad72c:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",
               uVar7,"ref_edge_rcm",(ulong)uVar3,pcVar9);
        return uVar3;
      }
      while (0 < local_68) {
        iVar11 = local_68 * 2;
        local_68 = local_68 + -1;
        uVar3 = ref_edge_rcm_queue(ref_edge,queue[iVar11 - 2],o2n,n2o,(REF_INT *)&local_64,queue,
                                   &local_68);
        if (uVar3 != 0) {
          pcVar9 = "min";
          uVar7 = 0x330;
          goto LAB_001ad72c;
        }
      }
      uVar8 = (ulong)local_64;
      uVar3 = local_40->n;
    } while ((int)local_64 < (int)uVar3);
    if (local_64 != uVar3) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",0x334,
             "ref_edge_rcm","reordering done not original nodes",(long)(int)local_64,
             (long)(int)uVar3);
      return 1;
    }
    pRVar6 = n2o;
    uVar5 = uVar8;
    if (0 < (int)local_64) {
      do {
        uVar5 = uVar5 - 1;
        queue[uVar5] = *pRVar6;
        pRVar6 = pRVar6 + 1;
      } while (uVar5 != 0);
      if (0 < (int)local_64) {
        memcpy(n2o,queue,(long)(int)local_64 << 2);
        free(queue);
        uVar5 = 0;
        do {
          o2n[n2o[uVar5]] = (REF_INT)uVar5;
          uVar5 = uVar5 + 1;
        } while (uVar8 != uVar5);
        goto LAB_001ad6cc;
      }
    }
  }
  free(queue);
LAB_001ad6cc:
  *local_50 = o2n;
  *local_48 = n2o;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_edge_rcm(REF_EDGE ref_edge, REF_INT **o2n_ptr,
                                REF_INT **n2o_ptr) {
  REF_NODE ref_node = ref_edge_node(ref_edge);
  REF_INT *o2n, *n2o, *queue;
  REF_INT min_degree, min_degree_node;
  REF_INT ndone, nqueue, node;

  *o2n_ptr = NULL;
  *n2o_ptr = NULL;
  ref_malloc_init(o2n, ref_node_max(ref_node), REF_INT, REF_EMPTY);
  ref_malloc(n2o, ref_node_n(ref_node), REF_INT);
  ref_malloc(queue, 2 * ref_node_n(ref_node), REF_INT);

  ndone = 0;
  nqueue = 0;

  while (ndone < ref_node_n(ref_node)) {
    RSS(ref_edge_min_degree_node(ref_edge, o2n, &min_degree, &min_degree_node),
        "min degree node");
    RSS(ref_edge_rcm_queue(ref_edge, min_degree_node, o2n, n2o, &ndone, queue,
                           &nqueue),
        "min");

    /* drain queue */
    while (nqueue > 0) {
      min_degree_node = queue[0 + 2 * (nqueue - 1)];
      min_degree = queue[1 + 2 * (nqueue - 1)];
      nqueue--;
      RSS(ref_edge_rcm_queue(ref_edge, min_degree_node, o2n, n2o, &ndone, queue,
                             &nqueue),
          "min");
    }
  }

  REIS(ndone, ref_node_n(ref_node), "reordering done not original nodes");

  /* reverse with queue as temporary space */
  for (node = 0; node < ndone; node++) {
    queue[ndone - node - 1] = n2o[node];
  }
  /* copy back */
  for (node = 0; node < ndone; node++) {
    n2o[node] = queue[node];
  }
  ref_free(queue);

  /* set o2n to reverse */
  for (node = 0; node < ndone; node++) {
    o2n[n2o[node]] = node;
  }

  *o2n_ptr = o2n;
  *n2o_ptr = n2o;

  return REF_SUCCESS;
}